

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

bool deqp::gls::BuiltinPrecisionTests::contains<tcu::Matrix<float,4,4>>
               (IVal *ival,Matrix<float,_4,_4> *value)

{
  bool bVar1;
  Matrix<float,_4,_4> *value_local;
  IVal *ival_local;
  
  bVar1 = ContainerTraits<tcu::Matrix<float,_4,_4>,_tcu::Matrix<tcu::Interval,_4,_4>_>::doContains
                    (ival,value);
  return bVar1;
}

Assistant:

bool contains (const typename Traits<T>::IVal& ival, const T& value)
{
	return Traits<T>::doContains(ival, value);
}